

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-msg.c
# Opt level: O0

wchar_t get_message_type(wchar_t msg_code,monster_race *race)

{
  monster_base *pmVar1;
  _Bool _Var2;
  monster_base *pmVar3;
  wchar_t local_1c;
  wchar_t type;
  monster_race *race_local;
  wchar_t msg_code_local;
  
  local_1c = msg_repository[msg_code].type;
  if ((local_1c == L'\x06') &&
     (_Var2 = flag_has_dbg(race->flags,0xb,1,"race->flags","RF_UNIQUE"), _Var2)) {
    pmVar1 = race->base;
    pmVar3 = lookup_monster_base("Morgoth");
    if (pmVar1 == pmVar3) {
      local_1c = L'\x95';
    }
    else {
      local_1c = L'\x94';
    }
  }
  return local_1c;
}

Assistant:

static int get_message_type(int msg_code, const struct monster_race *race)
{
	int type = msg_repository[msg_code].type;

	if (type == MSG_KILL) {
		/* Play a special sound if the monster was unique */
		if (rf_has(race->flags, RF_UNIQUE)) {
			if (race->base == lookup_monster_base("Morgoth")) {
				type = MSG_KILL_KING;
			} else {
				type = MSG_KILL_UNIQUE;
			}
		}
	}

	return type;
}